

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O3

void __thiscall DStrifeStatusBar::ShowPop(DStrifeStatusBar *this,int popnum)

{
  APlayerPawn *pAVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  int iVar5;
  APlayerPawn *pAVar6;
  bool bVar7;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  if (this->CurrentPop == popnum) {
    if (popnum == 2) {
      this->KeyPopPos = this->KeyPopPos + 10;
      this->KeyPopScroll = 0x118;
      pAVar6 = ((this->super_DBaseStatusBar).CPlayer)->mo;
      pAVar1 = (APlayerPawn *)(pAVar6->super_AActor).Inventory.field_0.p;
      if (pAVar1 != (APlayerPawn *)0x0) {
        if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
          iVar5 = 0;
          pPVar3 = AKey::RegistrationInfo.MyClass;
          do {
            pAVar6 = pAVar1;
            pPVar2 = *(PClass **)((long)&(pAVar6->super_AActor).super_DThinker.super_DObject + 8);
            pPVar4 = pPVar3;
            if (pPVar2 == (PClass *)0x0) {
              pPVar2 = (PClass *)
                       (*(code *)*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)
                                 (pAVar6);
              *(PClass **)((long)&(pAVar6->super_AActor).super_DThinker.super_DObject + 8) = pPVar2;
              pPVar4 = AKey::RegistrationInfo.MyClass;
            }
            bVar7 = pPVar2 != (PClass *)0x0;
            if (pPVar2 != pPVar3 && bVar7) {
              do {
                pPVar2 = pPVar2->ParentClass;
                bVar7 = pPVar2 != (PClass *)0x0;
                if (pPVar2 == pPVar3) break;
              } while (pPVar2 != (PClass *)0x0);
            }
            if (bVar7) {
              if (iVar5 == this->KeyPopPos) {
                return;
              }
              iVar5 = iVar5 + 1;
            }
            pAVar1 = (APlayerPawn *)(pAVar6->super_AActor).Inventory.field_0.p;
            if (pAVar1 == (APlayerPawn *)0x0) goto LAB_004aff83;
            pPVar3 = pPVar4;
          } while (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        }
        (pAVar6->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      }
    }
LAB_004aff83:
    this->PendingPop = 0;
    this->KeyPopScroll = 0;
    this->KeyPopPos = this->KeyPopPos + -10;
  }
  else {
    this->KeyPopPos = 0;
    this->PendingPop = popnum;
  }
  return;
}

Assistant:

void ShowPop (int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if (popnum == CurrentPop)
		{
			if (popnum == POP_Keys)
			{
				AInventory *item;
				int i;

				KeyPopPos += 10;
				KeyPopScroll = 280;

				for (item = CPlayer->mo->Inventory, i = 0;
					item != NULL;
					item = item->Inventory)
				{
					if (item->IsKindOf (RUNTIME_CLASS(AKey)))
					{
						if (i == KeyPopPos)
						{
							return;
						}
						i++;
					}
				}
			}
			PendingPop = POP_None;
			// Do not scroll keys horizontally when dropping the popscreen
			KeyPopScroll = 0;
			KeyPopPos -= 10;
		}
		else
		{
			KeyPopPos = 0;
			PendingPop = popnum;
		}
	}